

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

CK_RV __thiscall
SessionManager::openSession
          (SessionManager *this,Slot *slot,CK_FLAGS flags,CK_VOID_PTR pApplication,CK_NOTIFY notify,
          CK_SESSION_HANDLE_PTR phSession)

{
  bool bVar1;
  Token *this_00;
  Session *this_01;
  size_type sVar2;
  reference ppSVar3;
  CK_SESSION_HANDLE CVar4;
  size_type sVar5;
  uint in_EDX;
  Slot *in_RSI;
  long in_RDI;
  CK_SESSION_HANDLE *in_R9;
  size_t i;
  Session *session;
  bool rwSession;
  Token *token;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff38;
  MutexLocker *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  Session *pSVar6;
  vector<Session_*,_std::allocator<Session_*>_> *in_stack_ffffffffffffff50;
  Slot *in_stack_ffffffffffffff58;
  Session *in_stack_ffffffffffffff60;
  Token *in_stack_ffffffffffffff68;
  size_type local_78;
  CK_RV local_8;
  
  if (in_R9 == (CK_SESSION_HANDLE *)0x0) {
    local_8 = 7;
  }
  else if (in_RSI == (Slot *)0x0) {
    local_8 = 3;
  }
  else if ((in_EDX & 4) == 0) {
    local_8 = 0xb4;
  }
  else {
    MutexLocker::MutexLocker(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    this_00 = Slot::getToken(in_RSI);
    if (this_00 == (Token *)0x0) {
      local_8 = 0xe0;
    }
    else {
      bVar1 = Token::isInitialized(this_00);
      if (bVar1) {
        if (((in_EDX & 2) == 0) && (bVar1 = Token::isSOLoggedIn(in_stack_ffffffffffffff68), bVar1))
        {
          local_8 = 0xb8;
        }
        else {
          this_01 = (Session *)operator_new(0xa8);
          Session::Session(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),
                           in_stack_ffffffffffffff48,(CK_NOTIFY)in_stack_ffffffffffffff40);
          local_78 = 0;
          while (sVar5 = local_78,
                sVar2 = std::vector<Session_*,_std::allocator<Session_*>_>::size
                                  ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8)),
                sVar5 < sVar2) {
            ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                                ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),
                                 local_78);
            if (*ppSVar3 == (value_type)0x0) {
              pSVar6 = this_01;
              ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                                  ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),
                                   local_78);
              *ppSVar3 = pSVar6;
              Session::setHandle(this_01,local_78 + 1);
              CVar4 = Session::getHandle(this_01);
              *in_R9 = CVar4;
              local_8 = 0;
              goto LAB_001e810a;
            }
            local_78 = local_78 + 1;
          }
          std::vector<Session_*,_std::allocator<Session_*>_>::push_back
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          pSVar6 = this_01;
          sVar5 = std::vector<Session_*,_std::allocator<Session_*>_>::size
                            ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8));
          Session::setHandle(pSVar6,sVar5);
          in_stack_ffffffffffffff40 = (MutexLocker *)Session::getHandle(this_01);
          *in_R9 = (CK_SESSION_HANDLE)in_stack_ffffffffffffff40;
          local_8 = 0;
        }
      }
      else {
        local_8 = 0xe1;
      }
    }
LAB_001e810a:
    MutexLocker::~MutexLocker(in_stack_ffffffffffffff40);
  }
  return local_8;
}

Assistant:

CK_RV SessionManager::openSession
(
	Slot* slot,
	CK_FLAGS flags,
	CK_VOID_PTR pApplication,
	CK_NOTIFY notify,
	CK_SESSION_HANDLE_PTR phSession
)
{
	if (phSession == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (slot == NULL) return CKR_SLOT_ID_INVALID;
	if ((flags & CKF_SERIAL_SESSION) == 0) return CKR_SESSION_PARALLEL_NOT_SUPPORTED;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;
	if (!token->isInitialized()) return CKR_TOKEN_NOT_RECOGNIZED;

	// Can not open a Read-Only session when in SO mode
	if ((flags & CKF_RW_SESSION) == 0 && token->isSOLoggedIn()) return CKR_SESSION_READ_WRITE_SO_EXISTS;

	// TODO: Do we want to check for maximum number of sessions?
	// return CKR_SESSION_COUNT

	// Create the session
	bool rwSession = ((flags & CKF_RW_SESSION) == CKF_RW_SESSION) ? true : false;
	Session* session = new Session(slot, rwSession, pApplication, notify);

	// First fill any empty spot in the list
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] != NULL)
		{
			continue;
		}

		sessions[i] = session;
		session->setHandle(i + 1);
		*phSession = session->getHandle();

		return CKR_OK;
	}

	// Or add it to the end
	sessions.push_back(session);
	session->setHandle(sessions.size());
	*phSession = session->getHandle();

	return CKR_OK;
}